

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricGroupGetExportDataExp
          (zet_metric_group_handle_t hMetricGroup,uint8_t *pRawData,size_t rawDataSize,
          size_t *pExportDataSize,uint8_t *pExportData)

{
  zet_pfnMetricGroupGetExportDataExp_t pfnGetExportDataExp;
  ze_result_t result;
  uint8_t *pExportData_local;
  size_t *pExportDataSize_local;
  size_t rawDataSize_local;
  uint8_t *pRawData_local;
  zet_metric_group_handle_t hMetricGroup_local;
  
  pfnGetExportDataExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c8b0 != (code *)0x0) {
    pfnGetExportDataExp._4_4_ =
         (*DAT_0011c8b0)(hMetricGroup,pRawData,rawDataSize,pExportDataSize,pExportData);
  }
  return pfnGetExportDataExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupGetExportDataExp(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        const uint8_t* pRawData,                        ///< [in] buffer of raw data
        size_t rawDataSize,                             ///< [in] size in bytes of raw data buffer
        size_t* pExportDataSize,                        ///< [in,out] size in bytes of export data buffer
                                                        ///< if size is zero, then the driver shall update the value with the
                                                        ///< number of bytes necessary to store the exported data.
                                                        ///< if size is greater than required, then the driver shall update the
                                                        ///< value with the actual number of bytes necessary to store the exported data.
        uint8_t * pExportData                           ///< [in,out][optional][range(0, *pExportDataSize)] buffer of exported data.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetExportDataExp = context.zetDdiTable.MetricGroupExp.pfnGetExportDataExp;
        if( nullptr != pfnGetExportDataExp )
        {
            result = pfnGetExportDataExp( hMetricGroup, pRawData, rawDataSize, pExportDataSize, pExportData );
        }
        else
        {
            // generic implementation
        }

        return result;
    }